

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashSet.hpp
# Opt level: O0

Iterator __thiscall HashSet<String>::insert(HashSet<String> *this,Iterator *position,String *key)

{
  ItemBlock *pIVar1;
  Item *pIVar2;
  Item *pIVar3;
  bool bVar4;
  void *pvVar5;
  undefined8 *puVar6;
  usize uVar7;
  ItemBlock *pIVar8;
  Item *insertPos;
  Item **cell;
  usize hashCode;
  Item *end;
  Item *i;
  ItemBlock *itemBlock;
  Item *item;
  Iterator it;
  String *key_local;
  Iterator *position_local;
  HashSet<String> *this_local;
  
  it.item = (Item *)key;
  item = (Item *)find(this,key);
  bVar4 = Iterator::operator!=((Iterator *)&item,(Iterator *)this);
  if (bVar4) {
    this_local = (HashSet<String> *)item;
  }
  else {
    if (*(long *)(this + 0x20) == 0) {
      pvVar5 = operator_new__(*(long *)(this + 0x18) << 3);
      *(void **)(this + 0x20) = pvVar5;
      Memory::zero(*(void **)(this + 0x20),*(long *)(this + 0x18) << 3);
    }
    if (*(long *)(this + 0x70) == 0) {
      puVar6 = (undefined8 *)operator_new__(0x128);
      *puVar6 = *(undefined8 *)(this + 0x78);
      *(undefined8 **)(this + 0x78) = puVar6;
      itemBlock = (ItemBlock *)(puVar6 + 1);
      for (end = (Item *)(puVar6 + 10); end < (Item *)(puVar6 + 0x25); end = end + 1) {
        end->prev = *(Item **)(this + 0x70);
        *(Item **)(this + 0x70) = end;
      }
    }
    else {
      itemBlock = *(ItemBlock **)(this + 0x70);
      *(undefined8 *)(this + 0x70) = *(undefined8 *)(*(long *)(this + 0x70) + 0x38);
    }
    uVar7 = hash(&(it.item)->key);
    Item::Item((Item *)itemBlock,&(it.item)->key);
    pIVar8 = (ItemBlock *)(*(long *)(this + 0x20) + (uVar7 % *(ulong *)(this + 0x18)) * 8);
    itemBlock[5].next = pIVar8;
    pIVar1 = pIVar8->next;
    itemBlock[6].next = pIVar1;
    if (pIVar1 != (ItemBlock *)0x0) {
      itemBlock[6].next[5].next = itemBlock + 6;
    }
    pIVar8->next = itemBlock;
    pIVar2 = position->item;
    pIVar3 = pIVar2->prev;
    itemBlock[7].next = (ItemBlock *)pIVar3;
    if (pIVar3 == (Item *)0x0) {
      *(ItemBlock **)(this + 8) = itemBlock;
    }
    else {
      pIVar2->prev->next = (Item *)itemBlock;
    }
    itemBlock[8].next = (ItemBlock *)pIVar2;
    pIVar2->prev = (Item *)itemBlock;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    Iterator::Iterator((Iterator *)&this_local,(Item *)itemBlock);
  }
  return (Iterator)(Item *)this_local;
}

Assistant:

Iterator insert(const Iterator& position, const T& key)
  {
    Iterator it = find(key);
    if (it != _end) return it;

    if (!data)
    {
      data = (Item**)new char[sizeof(Item*) * capacity];
      Memory::zero(data, sizeof(Item*)* capacity);
    }

    Item* item;
    if (freeItem)
    {
      item = freeItem;
      freeItem = freeItem->prev;
    }
    else
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      item = (Item*)((char*)itemBlock + sizeof(ItemBlock));

      for (Item* i = item + 1, *end = item + 4; i < end; ++i)
      {
        i->prev = freeItem;
        freeItem = i;
      }
    }

    usize hashCode = hash(key);
#ifdef VERIFY
    VERIFY(new(item)Item(key) == item);
#else
    new(item)Item(key);
#endif

    Item** cell;
    item->cell = (cell = &data[hashCode % capacity]);
    if((item->nextCell = *cell))
      item->nextCell->cell = &item->nextCell;
    *cell = item;

    Item* insertPos = position.item;
    if ((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;

    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return item;
  }